

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprint.c
# Opt level: O2

void prvTidyPPrintTree(TidyDocImpl *doc,uint mode,uint indent,Node *node)

{
  TidyPrintImpl *pprint;
  int iVar1;
  Dict *pDVar2;
  Lexer *node_00;
  Bool BVar3;
  Bool BVar4;
  int iVar5;
  Dict *pDVar6;
  AttVal *pAVar7;
  Node **ppNVar8;
  ctmbstr ptVar9;
  Node *pNVar10;
  TidyTagId TVar11;
  uint *node_01;
  Lexer *pLVar12;
  Node *pNVar13;
  uint extraout_EDX;
  uint extraout_EDX_00;
  uint extraout_EDX_01;
  uint extraout_EDX_02;
  uint extraout_EDX_03;
  uint extraout_EDX_04;
  uint extraout_EDX_05;
  uint extraout_EDX_06;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 extraout_RDX_05;
  undefined8 extraout_RDX_06;
  undefined8 extraout_RDX_07;
  undefined8 extraout_RDX_08;
  undefined8 extraout_RDX_09;
  undefined8 extraout_RDX_10;
  undefined8 uVar14;
  uint mode_00;
  Node **ppNVar15;
  uint uVar16;
  bool bVar17;
  Lexer *local_60;
  char *local_50;
  
  if (node == (Node *)0x0) {
    return;
  }
  BVar4 = *(Bool *)((doc->config).value + 1);
  iVar1 = *(int *)((doc->config).value + 0x1a);
  if (doc->progressCallback != (TidyPPProgress)0x0) {
    (*doc->progressCallback)((TidyDoc)doc,node->line,node->column,(doc->pprint).line + 1);
  }
  node_01 = &switchD_00130edf::switchdataD_0014bde0;
  switch(node->type) {
  case RootNode:
    ppNVar15 = &node->content;
    while (pNVar10 = *ppNVar15, pNVar10 != (Node *)0x0) {
      prvTidyPPrintTree(doc,mode,indent,pNVar10);
      ppNVar15 = &pNVar10->next;
    }
    return;
  case DocTypeTag:
    PPrintDocType(doc,indent,node);
    return;
  case CommentTag:
    PPrintComment(doc,indent,node);
    return;
  case ProcInsTag:
    PPrintPI(doc,indent,node);
    return;
  case TextNode:
    PPrintText(doc,mode,indent,node);
    return;
  case CDATATag:
    PPrintCDATA(doc,indent,node);
    return;
  case SectionTag:
    PPrintSection(doc,indent,node);
    return;
  case AspTag:
    PPrintAsp(doc,indent,node);
    return;
  case JsteTag:
    PPrintJste(doc,indent,node);
    return;
  case PhpTag:
    PPrintPhp(doc,indent,node);
    return;
  case XmlDecl:
    PPrintXmlDecl(doc,indent,node);
    return;
  }
  mode_00 = (uint)node;
  pNVar10 = node;
  if ((node->tag != (Dict *)0x0) && (node->tag->id == TidyTag_MATHML)) {
    PPrintTag(doc,4,indent,node);
    ppNVar15 = &node->content;
    uVar14 = extraout_RDX;
    while( true ) {
      uVar16 = (uint)uVar14;
      pNVar13 = *ppNVar15;
      if (pNVar13 == (Node *)0x0) break;
      pNVar10 = pNVar13;
      prvTidyPPrintTree(doc,4,indent,pNVar13);
      ppNVar15 = &pNVar13->next;
      uVar14 = extraout_RDX_00;
    }
    goto LAB_0013146d;
  }
  BVar3 = prvTidynodeCMIsEmpty(node);
  if ((BVar3 != no) || ((node->type == StartEndTag && (iVar1 == 0)))) {
    BVar4 = prvTidynodeHasCM(node,0x10);
    if (BVar4 == no) {
      PCondFlushLineSmart(doc,indent);
    }
    pDVar6 = node->tag;
    if (pDVar6 != (Dict *)0x0) {
      TVar11 = pDVar6->id;
      if (TVar11 == TidyTag_BR) {
        if (node->prev != (Node *)0x0) {
          pDVar2 = node->prev->tag;
          if (pDVar2 == (Dict *)0x0) {
            if ((mode & 1) == 0) goto LAB_00131204;
          }
          else if (((mode & 1) == 0) && (pDVar2->id != TidyTag_BR)) {
LAB_00131204:
            if (*(int *)((doc->config).value + 0x28) != 0) {
              prvTidyPFlushLineSmart(doc,indent);
              pDVar6 = node->tag;
              if (pDVar6 == (Dict *)0x0) goto LAB_0013124a;
            }
          }
        }
        TVar11 = pDVar6->id;
      }
      if ((((TVar11 == TidyTag_HR) && (*(int *)((doc->config).value + 0x55) == 1)) &&
          (node->parent != (Node *)0x0)) && (node->parent->content != node)) {
        prvTidyPFlushLineSmart(doc,indent);
      }
    }
LAB_0013124a:
    PPrintTag(doc,mode,indent,node);
    if (node->next == (Node *)0x0) {
      return;
    }
    if (node->tag == (Dict *)0x0) {
      return;
    }
    TVar11 = node->tag->id;
    if ((TVar11 == TidyTag_PARAM) || (TVar11 == TidyTag_AREA)) {
      PCondFlushLineSmart(doc,indent);
      return;
    }
    if ((((byte)mode | TVar11 != TidyTag_BR) & TVar11 != TidyTag_HR) != 0) {
      return;
    }
    goto LAB_001312ad;
  }
  if (node->type == StartEndTag) {
    node->type = StartTag;
  }
  pDVar6 = node->tag;
  if (pDVar6 != (Dict *)0x0) {
    node_01 = (uint *)pDVar6->parser;
    if ((code *)node_01 != prvTidyParsePre) {
      TVar11 = pDVar6->id;
      if ((TVar11 == TidyTag_SCRIPT) || (TVar11 == TidyTag_STYLE)) {
        pprint = &doc->pprint;
        iVar1 = *(int *)((doc->config).value + 0x1a);
        do {
          if ((pNVar10->tag != (Dict *)0x0) && (pNVar10->tag->id == TidyTag_HEAD)) {
            prvTidyPFlushLineSmart(doc,indent);
            break;
          }
          pNVar10 = pNVar10->parent;
        } while (pNVar10 != (Node *)0x0);
        PCondFlushLineSmart(doc,indent);
        pLVar12 = (Lexer *)node;
        PPrintTag(doc,mode | 0x19,indent,node);
        prvTidyPFlushLineSmart(doc,indent);
        if ((iVar1 == 0) || (node->content == (Node *)0x0)) {
          bVar17 = false;
          local_50 = "";
          local_60 = (Lexer *)0x14b870;
          uVar14 = extraout_RDX_05;
        }
        else {
          pAVar7 = prvTidyAttrGetById(node,TidyAttr_TYPE);
          local_50 = "";
          local_60 = (Lexer *)0x14b870;
          if ((pAVar7 != (AttVal *)0x0) && (pAVar7->value != (ctmbstr)0x0)) {
            iVar5 = prvTidytmbstrcasecmp(pAVar7->value,"text/javascript");
            if (iVar5 == 0) {
              local_60 = (Lexer *)"//";
            }
            else if (pAVar7->value == (ctmbstr)0x0) {
              local_60 = (Lexer *)0x14b870;
            }
            else {
              iVar5 = prvTidytmbstrcasecmp(pAVar7->value,"text/css");
              if (iVar5 == 0) {
                local_60 = (Lexer *)0x14cf44;
                local_50 = "*/";
              }
              else {
                local_60 = (Lexer *)0x14b870;
                if (pAVar7->value != (ctmbstr)0x0) {
                  iVar5 = prvTidytmbstrcasecmp(pAVar7->value,"text/vbscript");
                  pLVar12 = (Lexer *)0x167929;
                  local_50 = "";
                  local_60 = pLVar12;
                  if (iVar5 != 0) {
                    pLVar12 = (Lexer *)0x14b870;
                    local_60 = pLVar12;
                  }
                }
              }
            }
          }
          pNVar10 = node->content;
          if (pNVar10->type == TextNode) {
            pLVar12 = doc->lexer;
            ptVar9 = prvTidytmbsubstrn(pLVar12->lexbuf + pNVar10->start,
                                       (pNVar10->end - pNVar10->start) + 1,"<![CDATA[");
            if (ptVar9 != (ctmbstr)0x0) {
              bVar17 = true;
              uVar14 = extraout_RDX_06;
              goto LAB_001317f3;
            }
          }
          uVar16 = WrapOff(doc);
          AddString(pprint,(ctmbstr)local_60);
          AddString(pprint,"<![CDATA[");
          AddString(pprint,local_50);
          PCondFlushLineSmart(doc,indent);
          WrapOn(doc,uVar16);
          bVar17 = false;
          uVar14 = extraout_RDX_07;
        }
LAB_001317f3:
        iVar5 = -1;
        ppNVar15 = &node->content;
        ppNVar8 = ppNVar15;
        while (node_00 = (Lexer *)*ppNVar8, node_00 != (Lexer *)0x0) {
          pLVar12 = node_00;
          prvTidyPPrintTree(doc,mode | 0x19,indent,(Node *)node_00);
          uVar14 = extraout_RDX_08;
          if (node_00 == (Lexer *)node->last) {
            iVar5 = TextEndsWithNewline(doc->lexer,(Node *)node_00,0x10);
            uVar14 = extraout_RDX_09;
          }
          ppNVar8 = (Node **)&node_00->insertspace;
        }
        if (iVar5 < 0) {
          PCondFlushLineSmart(doc,indent);
          uVar14 = extraout_RDX_10;
        }
        pNVar13 = (Node *)CONCAT71((int7)((ulong)pLVar12 >> 8),iVar1 == 0);
        pNVar10 = *ppNVar15;
        uVar16 = (uint)CONCAT71((int7)((ulong)uVar14 >> 8),pNVar10 == (Node *)0x0);
        if ((!bVar17 && pNVar10 != (Node *)0x0) && iVar1 != 0) {
          uVar16 = WrapOff(doc);
          AddString(pprint,(ctmbstr)local_60);
          AddString(pprint,"]]>");
          AddString(pprint,local_50);
          WrapOn(doc,uVar16);
          PCondFlushLineSmart(doc,indent);
          pNVar10 = *ppNVar15;
          uVar16 = extraout_EDX_05;
        }
        if ((pNVar10 != (Node *)0x0) && ((doc->pprint).indent[0].spaces != indent)) {
          (doc->pprint).indent[0].spaces = indent;
        }
        PPrintEndTag(doc,mode_00,uVar16,pNVar13);
        if (*(int *)((doc->config).value + 0x14) != 0) {
          return;
        }
        if (node->next == (Node *)0x0) {
          return;
        }
        BVar4 = prvTidynodeHasCM(node,0x10);
        if (BVar4 != no) {
          return;
        }
        BVar4 = prvTidynodeIsText(node);
        if (BVar4 != no) {
          return;
        }
        goto LAB_001312ad;
      }
      if (TVar11 != TidyTag_TEXTAREA) goto LAB_0013117c;
    }
    iVar1 = *(int *)((doc->config).value + 0x55);
    PCondFlushLineSmart(doc,indent);
    if (((iVar1 == 1) && (node->parent != (Node *)0x0)) && (node->parent->content != node)) {
      prvTidyPFlushLineSmart(doc,indent);
    }
    PPrintTag(doc,mode,indent,node);
    ppNVar15 = &node->content;
    uVar14 = extraout_RDX_01;
    while (pNVar13 = *ppNVar15, pNVar13 != (Node *)0x0) {
      pNVar10 = pNVar13;
      prvTidyPPrintTree(doc,mode | 9,0,pNVar13);
      uVar14 = extraout_RDX_02;
      ppNVar15 = &pNVar13->next;
    }
    PPrintEndTag(doc,mode_00,(uint)uVar14,pNVar10);
    if (*(int *)((doc->config).value + 0x14) != 0) {
      return;
    }
    if (node->next == (Node *)0x0) {
      return;
    }
    goto LAB_001312ad;
  }
LAB_0013117c:
  BVar3 = prvTidynodeCMIsInline(node);
  if (BVar3 != no) {
    if (((*(int *)((doc->config).value + 0x20) != 0) && (node->tag != (Dict *)0x0)) &&
       (node->tag->id == TidyTag_NOBR)) {
      ppNVar15 = &node->content;
      while (pNVar10 = *ppNVar15, pNVar10 != (Node *)0x0) {
        prvTidyPPrintTree(doc,mode | 8,indent,pNVar10);
        ppNVar15 = &pNVar10->next;
      }
      return;
    }
    PPrintTag(doc,mode,indent,node);
    BVar3 = ShouldIndent(doc,node);
    if (BVar3 == no) {
      ppNVar15 = &node->content;
      uVar14 = extraout_RDX_03;
      while( true ) {
        uVar16 = (uint)uVar14;
        pNVar13 = *ppNVar15;
        if (pNVar13 == (Node *)0x0) break;
        pNVar10 = pNVar13;
        prvTidyPPrintTree(doc,mode,indent,pNVar13);
        ppNVar15 = &pNVar13->next;
        uVar14 = extraout_RDX_04;
      }
    }
    else {
      PCondFlushLineSmart(doc,BVar4 + indent);
      ppNVar15 = &node->content;
      while (pNVar13 = *ppNVar15, pNVar13 != (Node *)0x0) {
        pNVar10 = pNVar13;
        prvTidyPPrintTree(doc,mode,BVar4 + indent,pNVar13);
        ppNVar15 = &pNVar13->next;
      }
      PCondFlushLineSmart(doc,indent);
      uVar16 = extraout_EDX;
    }
LAB_0013146d:
    PPrintEndTag(doc,mode_00,uVar16,pNVar10);
    return;
  }
  bVar17 = true;
  if (*(int *)((doc->config).value + 0x17) == 0) {
    bVar17 = *(int *)((doc->config).value + 0x16) != 0;
  }
  iVar1 = *(int *)((doc->config).value + 0x14);
  iVar5 = *(int *)((doc->config).value + 0x55);
  if (((iVar5 == 1) && (node->parent != (Node *)0x0)) &&
     ((node->parent->content != node &&
      ((node->tag == (Dict *)0x0 || (node->tag->id != TidyTag_HTML)))))) {
    prvTidyPFlushLineSmart(doc,indent);
  }
  BVar3 = ShouldIndent(doc,node);
  if (BVar3 != no) {
    BVar3 = BVar4;
  }
  PCondFlushLineSmart(doc,indent);
  if (((iVar1 == 2) && (iVar5 == 1)) && (node->prev != (Node *)0x0)) {
    prvTidyPFlushLineSmart(doc,indent);
  }
  uVar16 = BVar3 + indent;
  if (((bVar17) && (BVar3 = prvTidynodeHasCM(node,0x200000), BVar3 != no)) &&
     (node->attributes == (AttVal *)0x0)) {
    BVar3 = ShouldIndent(doc,node);
    if (BVar3 == no) {
      BVar4 = no;
    }
    uVar16 = uVar16 - BVar4;
  }
  else {
    node_01 = (uint *)node;
    PPrintTag(doc,mode,indent,node);
    BVar4 = ShouldIndent(doc,node);
    if (BVar4 == no) {
      BVar4 = prvTidynodeHasCM(node,2);
      if (((BVar4 != no) || ((node->tag != (Dict *)0x0 && (node->tag->id == TidyTag_NOFRAMES)))) ||
         ((BVar4 = prvTidynodeHasCM(node,4), BVar4 != no &&
          ((node->tag == (Dict *)0x0 || (node->tag->id != TidyTag_TITLE)))))) {
        prvTidyPFlushLineSmart(doc,uVar16);
      }
    }
    else if (((node->tag == (Dict *)0x0) || (node->tag->id != TidyTag_LI)) ||
            (BVar4 = prvTidynodeIsText(node->content), BVar4 == no)) {
      PCondFlushLineSmart(doc,uVar16);
    }
  }
  ppNVar15 = &node->content;
  ppNVar8 = ppNVar15;
  pNVar10 = (Node *)0x0;
  while (pNVar13 = *ppNVar8, pNVar13 != (Node *)0x0) {
    if (((pNVar10 != (Node *)0x0 && iVar1 == 0) && (BVar4 = prvTidynodeIsText(pNVar10), BVar4 != no)
        ) && ((pNVar13->tag != (Dict *)0x0 && (BVar4 = prvTidynodeHasCM(pNVar13,0x10), BVar4 == no))
             )) {
      prvTidyPFlushLineSmart(doc,uVar16);
    }
    node_01 = (uint *)pNVar13;
    prvTidyPPrintTree(doc,mode,uVar16,pNVar13);
    pNVar10 = pNVar13;
    ppNVar8 = &pNVar13->next;
  }
  BVar4 = ShouldIndent(doc,node);
  if (BVar4 == no) {
    if (!bVar17) {
      BVar4 = prvTidynodeHasCM(node,2);
      if (((BVar4 == no) && ((node->tag == (Dict *)0x0 || (node->tag->id != TidyTag_NOFRAMES)))) &&
         ((BVar4 = prvTidynodeHasCM(node,4), uVar16 = extraout_EDX_03, BVar4 == no ||
          ((node->tag != (Dict *)0x0 && (node->tag->id == TidyTag_TITLE)))))) goto LAB_00131726;
      goto LAB_0013169f;
    }
    BVar4 = prvTidynodeHasCM(node,0x8000);
    uVar16 = extraout_EDX_02;
    if (BVar4 == no) {
LAB_00131726:
      if (iVar5 == 1) {
        do {
          pNVar10 = *ppNVar15;
          if (pNVar10 == (Node *)0x0) {
            prvTidyPFlushLineSmart(doc,indent);
            uVar16 = extraout_EDX_06;
            break;
          }
          BVar4 = prvTidynodeIsText(pNVar10);
          ppNVar15 = &pNVar10->next;
          uVar16 = extraout_EDX_04;
        } while (BVar4 == no);
      }
      goto LAB_00131918;
    }
LAB_00131935:
    if (iVar5 != 1) {
      return;
    }
  }
  else {
LAB_0013169f:
    PCondFlushLineSmart(doc,indent);
    uVar16 = extraout_EDX_00;
    if ((bVar17) && (BVar4 = prvTidynodeHasCM(node,0x8000), uVar16 = extraout_EDX_01, BVar4 != no))
    goto LAB_00131935;
LAB_00131918:
    PPrintEndTag(doc,mode_00,uVar16,(Node *)node_01);
    if (iVar1 != 0 || bVar17) goto LAB_00131935;
    if (node->tag != (Dict *)0x0) {
      if ((iVar5 != 1) && (node->tag->id != TidyTag_HTML)) goto LAB_001312ad;
      goto LAB_00131935;
    }
    if (iVar5 != 1) goto LAB_001312ad;
  }
  if ((node->next == (Node *)0x0) || (BVar4 = prvTidynodeHasCM(node,0xe8), BVar4 == no)) {
    return;
  }
LAB_001312ad:
  prvTidyPFlushLineSmart(doc,indent);
  return;
}

Assistant:

void TY_(PPrintTree)( TidyDocImpl* doc, uint mode, uint indent, Node *node )
{
    Node *content, *last;
    uint spaces = cfg( doc, TidyIndentSpaces );
    Bool xhtml = cfgBool( doc, TidyXhtmlOut );

    if ( node == NULL )
        return;

    if (doc->progressCallback)
    {
        doc->progressCallback( tidyImplToDoc(doc), node->line, node->column, doc->pprint.line + 1 );
    }

    if (node->type == TextNode)
    {
        PPrintText( doc, mode, indent, node );
    }
    else if ( node->type == CommentTag )
    {
        PPrintComment( doc, indent, node );
    }
    else if ( node->type == RootNode )
    {
        for ( content = node->content; content; content = content->next )
           TY_(PPrintTree)( doc, mode, indent, content );
    }
    else if ( node->type == DocTypeTag )
        PPrintDocType( doc, indent, node );
    else if ( node->type == ProcInsTag)
        PPrintPI( doc, indent, node );
    else if ( node->type == XmlDecl)
        PPrintXmlDecl( doc, indent, node );
    else if ( node->type == CDATATag)
        PPrintCDATA( doc, indent, node );
    else if ( node->type == SectionTag)
        PPrintSection( doc, indent, node );
    else if ( node->type == AspTag)
        PPrintAsp( doc, indent, node );
    else if ( node->type == JsteTag)
        PPrintJste( doc, indent, node );
    else if ( node->type == PhpTag)
        PPrintPhp( doc, indent, node );
    else if ( nodeIsMATHML(node) )
        PPrintMathML( doc, indent, node ); /* #130 MathML attr and entity fix! */
    else if ( TY_(nodeCMIsEmpty)(node) ||
              (node->type == StartEndTag && !xhtml) )
    {
        /* Issue #8 - flush to new line? 
           maybe use if ( TY_(nodeHasCM)(node, CM_BLOCK) ) instead
           or remove the CM_INLINE from the tag
         */
        if ( ! TY_(nodeHasCM)(node, CM_INLINE) )
            PCondFlushLineSmart( doc, indent );

        if ( nodeIsBR(node) && node->prev &&
             !(nodeIsBR(node->prev) || (mode & PREFORMATTED)) &&
             cfgBool(doc, TidyBreakBeforeBR) )
            TY_(PFlushLineSmart)( doc, indent );

        if ( nodeIsHR(node) )
        {
            /* insert extra newline for classic formatting */
            Bool classic = TidyClassicVS; /* #228 - cfgBool( doc, TidyVertSpace ); */
            if (classic && node->parent && node->parent->content != node)
            {
                TY_(PFlushLineSmart)( doc, indent );
            }
        }

        PPrintTag( doc, mode, indent, node );

        if (node->next)
        {
          if (nodeIsPARAM(node) || nodeIsAREA(node))
              PCondFlushLineSmart(doc, indent);
          else if ((nodeIsBR(node) && !(mode & PREFORMATTED))
                   || nodeIsHR(node))
              TY_(PFlushLineSmart)(doc, indent);
        }
    }
    else /* some kind of container element */
    {
        if ( node->type == StartEndTag )
            node->type = StartTag;

        if ( node->tag && 
             (node->tag->parser == TY_(ParsePre) || nodeIsTEXTAREA(node)) )
        {
            Bool classic  = TidyClassicVS; /* #228 - cfgBool( doc, TidyVertSpace ); */
            uint indprev = indent;

            PCondFlushLineSmart( doc, indent ); /* about to add <pre> tag - clear any previous */

            /* insert extra newline for classic formatting */
            if (classic && node->parent && node->parent->content != node)
            {
                TY_(PFlushLineSmart)( doc, indent );
            }

            PPrintTag( doc, mode, indent, node );   /* add <pre> or <textarea> tag */

            indent = 0;
            /* @camoy Fix #158 - remove inserted newlines in pre - TY_(PFlushLineSmart)( doc, indent ); */

            for ( content = node->content; content; content = content->next )
            {
                TY_(PPrintTree)( doc, (mode | PREFORMATTED | NOWRAP),
                                 indent, content );
            }

            /* @camoy Fix #158 - remove inserted newlines in pre - PCondFlushLineSmart( doc, indent ); */
            indent = indprev;
            PPrintEndTag( doc, mode, indent, node );

            if ( cfgAutoBool(doc, TidyIndentContent) == TidyNoState
                 && node->next != NULL )
                TY_(PFlushLineSmart)( doc, indent );
        }
        else if ( nodeIsSTYLE(node) || nodeIsSCRIPT(node) )
        {
            PPrintScriptStyle( doc, (mode | PREFORMATTED | NOWRAP | CDATA),
                               indent, node );
        }
        else if ( TY_(nodeCMIsInline)(node) )
        {
            if ( cfgBool(doc, TidyMakeClean) )
            {
                /* replace <nobr>...</nobr> by &nbsp; or &#160; etc. */
                if ( nodeIsNOBR(node) )
                {
                    for ( content = node->content;
                          content != NULL;
                          content = content->next)
                        TY_(PPrintTree)( doc, mode|NOWRAP, indent, content );
                    return;
                }
            }

            /* otherwise a normal inline element */
            PPrintTag( doc, mode, indent, node );

            /* indent content for SELECT, TEXTAREA, MAP, OBJECT and APPLET */
            if ( ShouldIndent(doc, node) )
            {
                indent += spaces;
                PCondFlushLineSmart( doc, indent );

                for ( content = node->content;
                      content != NULL;
                      content = content->next )
                    TY_(PPrintTree)( doc, mode, indent, content );

                indent -= spaces;
                PCondFlushLineSmart( doc, indent );
                /* PCondFlushLine( doc, indent ); */
            }
            else
            {
                for ( content = node->content;
                      content != NULL;
                      content = content->next )
                    TY_(PPrintTree)( doc, mode, indent, content );
            }
            PPrintEndTag( doc, mode, indent, node );
        }
        else /* other tags */
        {
            Bool indcont  = ( cfgAutoBool(doc, TidyIndentContent) != TidyNoState );
            Bool indsmart = ( cfgAutoBool(doc, TidyIndentContent) == TidyAutoState );
            Bool hideend  = cfgBool( doc, TidyHideEndTags ) ||
              cfgBool( doc, TidyOmitOptionalTags );
            Bool classic  = TidyClassicVS; /* #228 - cfgBool( doc, TidyVertSpace ); */
            uint contentIndent = indent;

            /* insert extra newline for classic formatting */
            if (classic && node->parent && node->parent->content != node && !nodeIsHTML(node))
            {
                TY_(PFlushLineSmart)( doc, indent );
            }

            if ( ShouldIndent(doc, node) )
                contentIndent += spaces;

            PCondFlushLineSmart( doc, indent );

            /*\
             *  Issue #180 - with the above PCondFlushLine, 
             *  this adds an uneccessary additional line!
             *  Maybe only if 'classic' ie --vertical-space yes 
            \*/
            if ( indsmart && node->prev != NULL && classic)
                TY_(PFlushLineSmart)( doc, indent );

            /* do not omit elements with attributes */
            if ( !hideend || !TY_(nodeHasCM)(node, CM_OMITST) ||
                 node->attributes != NULL )
            {
                PPrintTag( doc, mode, indent, node );

                if ( ShouldIndent(doc, node) )
                {
                    /* fix for bug 530791, don't wrap after */
                    /* <li> if first child is text node     */
                    if (!(nodeIsLI(node) && TY_(nodeIsText)(node->content)))
                        PCondFlushLineSmart( doc, contentIndent );
                }
                else if ( TY_(nodeHasCM)(node, CM_HTML) || nodeIsNOFRAMES(node) ||
                          (TY_(nodeHasCM)(node, CM_HEAD) && !nodeIsTITLE(node)) )
                    TY_(PFlushLineSmart)( doc, contentIndent );
            }
            else if ( ShouldIndent(doc, node) )
            {
                /*\
                 * Issue #180 - If the tag was NOT printed due to the -omit option,
                 * then reduce the bumped indent under the same ShouldIndent(doc, node) 
                 * conditions that caused the indent to be bumped.
                \*/
                contentIndent -= spaces;
            }

            last = NULL;
            for ( content = node->content; content; content = content->next )
            {
                /* kludge for naked text before block level tag */
                if ( last && !indcont && TY_(nodeIsText)(last) &&
                     content->tag && !TY_(nodeHasCM)(content, CM_INLINE) )
                {
                    /* TY_(PFlushLine)(fout, indent); */
                    TY_(PFlushLineSmart)( doc, contentIndent );
                }

                TY_(PPrintTree)( doc, mode, contentIndent, content );
                last = content;
            }

            /* don't flush line for td and th */
            if ( ShouldIndent(doc, node) ||
                 ( !hideend &&
                   ( TY_(nodeHasCM)(node, CM_HTML) || 
                     nodeIsNOFRAMES(node) ||
                     (TY_(nodeHasCM)(node, CM_HEAD) && !nodeIsTITLE(node))
                   )
                 )
               )
            {
                PCondFlushLineSmart( doc, indent );
                if ( !hideend || !TY_(nodeHasCM)(node, CM_OPT) )
                {
                    PPrintEndTag( doc, mode, indent, node );
                    /* TY_(PFlushLine)( doc, indent ); */
                }
            }
            else
            {
                if ( !hideend || !TY_(nodeHasCM)(node, CM_OPT) )
                {
                    /* newline before endtag for classic formatting */
                    if ( classic && !HasMixedContent(node) )
                        TY_(PFlushLineSmart)( doc, indent );
                    PPrintEndTag( doc, mode, indent, node );
                }
            }

            if (!indcont && !hideend && !nodeIsHTML(node) && !classic)
                TY_(PFlushLineSmart)( doc, indent );
            else if (classic && node->next != NULL && TY_(nodeHasCM)(node, CM_LIST|CM_DEFLIST|CM_TABLE|CM_BLOCK/*|CM_HEADING*/))
                TY_(PFlushLineSmart)( doc, indent );
        }
    }
}